

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeStringEq<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          StringEqOp op)

{
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"unimplemented instruction",&local_21);
  ParseInput::err(&local_48,&ctx->in,&local_68);
  std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
  _Variant_storage<1ul,wasm::WATParser::Err>
            ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
             __return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeStringEq(Ctx& ctx, Index pos, StringEqOp op) {
  return ctx.in.err("unimplemented instruction");
}